

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O2

int32_t icu_63::anon_unknown_7::getReorderCode(char *s)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 0x1000;
  lVar4 = 0;
  while ((iVar2 = -1, lVar4 != 0x14 &&
         (iVar1 = uprv_stricmp_63(s,(char *)((long)&_ZN6icu_6312_GLOBAL__N_116collReorderCodesE_rel
                                            + (long)*(int *)((long)&
                                                  _ZN6icu_6312_GLOBAL__N_116collReorderCodesE_rel +
                                                  lVar4))), iVar2 = iVar3, iVar1 != 0))) {
    lVar4 = lVar4 + 4;
    iVar3 = iVar3 + 1;
  }
  return iVar2;
}

Assistant:

int32_t getReorderCode(const char *s) {
    for (int32_t i = 0; i < UPRV_LENGTHOF(collReorderCodes); ++i) {
        if (uprv_stricmp(s, collReorderCodes[i]) == 0) {
            return UCOL_REORDER_CODE_FIRST + i;
        }
    }
    // Not supporting "others" = UCOL_REORDER_CODE_OTHERS
    // as a synonym for Zzzz = USCRIPT_UNKNOWN for now:
    // Avoid introducing synonyms/aliases.
    return -1;
}